

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O0

_Bool HMAC_Create(COSE_MacMessage *pcose,int HSize,int TSize,byte *pbKey,size_t cbKey,
                 byte *pbAuthData,size_t cbAuthData,cose_errback *perr)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  mbedtls_md_info_t *md_info;
  cn_cbor *cb_value;
  mbedtls_md_info_t *info;
  char *md_name;
  mbedtls_md_context_t contx;
  byte *rgbOut;
  byte *pbAuthData_local;
  size_t cbKey_local;
  byte *pbKey_local;
  int TSize_local;
  int HSize_local;
  COSE_MacMessage *pcose_local;
  
  contx.hmac_ctx = (void *)0x0;
  if (HSize == 0x100) {
    info = (mbedtls_md_info_t *)0x3bd84a;
  }
  else if (HSize == 0x180) {
    info = (mbedtls_md_info_t *)0x3ba3fb;
  }
  else {
    if (HSize != 0x200) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
      goto LAB_003388f9;
    }
    info = (mbedtls_md_info_t *)anon_var_dwarf_343cc4;
  }
  mbedtls_md_init((mbedtls_md_context_t *)&md_name);
  md_info = mbedtls_md_info_from_string((char *)info);
  mbedtls_md_setup((mbedtls_md_context_t *)&md_name,md_info,1);
  bVar1 = mbedtls_md_get_size(md_info);
  contx.hmac_ctx = calloc((ulong)bVar1,1);
  if (contx.hmac_ctx == (void *)0x0) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_OUT_OF_MEMORY;
    }
  }
  else {
    iVar3 = mbedtls_md_hmac_starts((mbedtls_md_context_t *)&md_name,pbKey,cbKey);
    if (iVar3 == 0) {
      iVar3 = mbedtls_md_hmac_update((mbedtls_md_context_t *)&md_name,pbAuthData,cbAuthData);
      if (iVar3 == 0) {
        iVar3 = mbedtls_md_hmac_finish((mbedtls_md_context_t *)&md_name,(uchar *)contx.hmac_ctx);
        if (iVar3 == 0) {
          cb_value = cn_cbor_data_create((uint8_t *)contx.hmac_ctx,TSize / 8,(cn_cbor_errback *)0x0)
          ;
          _Var2 = _COSE_array_replace(&pcose->m_message,cb_value,3,(cn_cbor_errback *)0x0);
          if (_Var2) {
            mbedtls_md_free((mbedtls_md_context_t *)&md_name);
            return true;
          }
          if (perr != (cose_errback *)0x0) {
            perr->err = COSE_ERR_CBOR;
          }
        }
        else if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_CRYPTO_FAIL;
        }
      }
      else if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_CRYPTO_FAIL;
      }
    }
    else if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_CRYPTO_FAIL;
    }
  }
LAB_003388f9:
  free(contx.hmac_ctx);
  mbedtls_md_free((mbedtls_md_context_t *)&md_name);
  return false;
}

Assistant:

bool HMAC_Create(COSE_MacMessage * pcose, int HSize, int TSize, const byte * pbKey, size_t cbKey, const byte * pbAuthData, size_t cbAuthData, cose_errback * perr)
{
	byte * rgbOut = NULL;
//	unsigned int cbOut;
	mbedtls_md_context_t contx;
	const char* md_name;
	const struct mbedtls_md_info_t * info;

#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pcose->m_message.m_allocContext;
#endif

	switch (HSize) {
		case 256: md_name = "SHA256"; break;
		case 384: md_name = "SHA384"; break;
		case 512: md_name = "SHA512"; break;
		default: FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER); break;
	}

	if (0) {
	errorReturn:
		COSE_FREE(rgbOut, context);
		mbedtls_md_free(&contx); 
		return false;
	}

	mbedtls_md_init(&contx);
	info = mbedtls_md_info_from_string (md_name);
	mbedtls_md_setup( &contx, info, 1 );

	rgbOut = COSE_CALLOC(mbedtls_md_get_size(info), 1, context);
	CHECK_CONDITION(rgbOut != NULL, COSE_ERR_OUT_OF_MEMORY);

	CHECK_CONDITION(!(mbedtls_md_hmac_starts (&contx, pbKey, cbKey)), COSE_ERR_CRYPTO_FAIL);
	CHECK_CONDITION(!(mbedtls_md_hmac_update (&contx, pbAuthData, cbAuthData)), COSE_ERR_CRYPTO_FAIL);
	CHECK_CONDITION(!(mbedtls_md_hmac_finish (&contx, rgbOut)), COSE_ERR_CRYPTO_FAIL);

	CHECK_CONDITION(_COSE_array_replace(&pcose->m_message, cn_cbor_data_create(rgbOut, TSize / 8, CBOR_CONTEXT_PARAM_COMMA NULL), INDEX_MAC_TAG, CBOR_CONTEXT_PARAM_COMMA NULL), COSE_ERR_CBOR);

	mbedtls_md_free(&contx); 
	return true;
}